

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::SyncPointVk::~SyncPointVk(SyncPointVk *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  SyncPointVk *this_00;
  ulong uVar4;
  
  if (1 < this->m_NumSemaphores) {
    this_00 = this + 1;
    uVar4 = 1;
    do {
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)this_00);
      uVar4 = uVar4 + 1;
      this_00 = (SyncPointVk *)
                &(this_00->m_Fence).m_pManager.
                 super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount;
    } while (uVar4 < this->m_NumSemaphores);
  }
  VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
  ~RecycledSyncObject(this->m_Semaphores);
  VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkFenceType>::
  ~RecycledSyncObject(&this->m_Fence);
  p_Var2 = (this->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
           super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

SyncPointVk::~SyncPointVk()
{
    // Call destructors for semaphores
    for (Uint32 s = _countof(m_Semaphores); s < m_NumSemaphores; ++s)
        m_Semaphores[s].~RecycledSyncObject();
}